

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O1

void __thiscall mocker::ir::BuilderContext::emplaceInst<mocker::ir::Ret>(BuilderContext *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mocker::ir::IRInst> local_18;
  
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ee8;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0xd;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Ret_001f0f38;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Ret_001f0f58;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  appendInst(this,&local_18);
  if (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }